

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

int __thiscall glslang::TScanContext::precisionKeyword(TScanContext *this)

{
  TParseContextBase *pTVar1;
  int iVar2;
  
  pTVar1 = this->parseContext;
  if (((pTVar1->super_TParseVersions).profile != EEsProfile) &&
     ((pTVar1->super_TParseVersions).version < 0x82)) {
    if ((pTVar1->super_TParseVersions).forwardCompatible == true) {
      (*(pTVar1->super_TParseVersions)._vptr_TParseVersions[0x2e])
                (pTVar1,&this->loc,"using ES precision qualifier keyword",this->tokenText,"");
    }
    iVar2 = identifierOrType(this);
    return iVar2;
  }
  return this->keyword;
}

Assistant:

int TScanContext::precisionKeyword()
{
    if (parseContext.isEsProfile() || parseContext.version >= 130)
        return keyword;

    if (parseContext.isForwardCompatible())
        parseContext.warn(loc, "using ES precision qualifier keyword", tokenText, "");

    return identifierOrType();
}